

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTestResult.cpp
# Opt level: O0

void __thiscall
UnitTest::DeferredTestResult::DeferredTestResult(DeferredTestResult *this,char *suite,char *test)

{
  char *__s;
  allocator<char> local_36;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  char *local_20;
  char *test_local;
  char *suite_local;
  DeferredTestResult *this_local;
  
  local_20 = test;
  test_local = suite;
  suite_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,suite,&local_21);
  std::allocator<char>::~allocator(&local_21);
  __s = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->testName,__s,local_35);
  std::allocator<char>::~allocator(local_35);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->failureFile,"",&local_36);
  std::allocator<char>::~allocator(&local_36);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->failures);
  this->timeElapsed = 0.0;
  this->failed = false;
  return;
}

Assistant:

DeferredTestResult::DeferredTestResult(char const* suite, char const* test)
	: suiteName(suite)
	, testName(test)
	, failureFile("")
	, timeElapsed(0.0f)
	, failed(false)
{
}